

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O1

int ON_UuidCompare(ON_UUID *a,ON_UUID *b)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (a == (ON_UUID *)0x0) {
    return -(uint)(b != (ON_UUID *)0x0);
  }
  if (b == (ON_UUID *)0x0) {
    return 1;
  }
  iVar1 = -1;
  if (b->Data1 <= a->Data1) {
    if (b->Data1 < a->Data1) {
      return 1;
    }
    if (b->Data2 <= a->Data2) {
      if (b->Data2 < a->Data2) {
        return 1;
      }
      if ((b->Data3 <= a->Data3) && (iVar1 = 1, a->Data3 <= b->Data3)) {
        uVar2 = *(ulong *)a->Data4;
        uVar3 = *(ulong *)b->Data4;
        uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
        uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                uVar3 << 0x38;
        return (uint)(uVar3 < uVar2) - (uint)(uVar2 < uVar3);
      }
    }
  }
  return iVar1;
}

Assistant:

int ON_UuidCompare( const ON_UUID* a, const ON_UUID* b )
{
  // NOTE WELL: This code has to work the same way
  //            on Windows and non-Windows OSs and on
  //            both big and little endian CPUs
  //            taking into account the way ON_UUIDs
  //            are read/written by ON_BinaryArchive.
  //
  //            On Windows, ::UuidCompare() must agree 
  //            with this function.

  if ( !a ) 
  {
    return b ? -1 : 0;
  }
  if ( !b )
    return 1;

  if ( a->Data1 < b->Data1 ) return -1;
  if ( a->Data1 > b->Data1 ) return  1;

  if ( a->Data2 < b->Data2 ) return -1;
  if ( a->Data2 > b->Data2 ) return  1;

  if ( a->Data3 < b->Data3 ) return -1;
  if ( a->Data3 > b->Data3 ) return  1;
  return memcmp(a->Data4,b->Data4,sizeof(a->Data4));
}